

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_select.cpp
# Opt level: O1

void duckdb::ListSelectFunction<duckdb::SetSelectionVectorSelect>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  idx_t count;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  byte bVar3;
  undefined8 uVar4;
  element_type *peVar5;
  bool bVar6;
  reference this;
  reference this_00;
  Vector *other;
  Vector *pVVar7;
  idx_t iVar8;
  ulong uVar9;
  TemplatedValidityData<unsigned_long> *pTVar10;
  InvalidInputException *this_01;
  ulong uVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  Vector *this_02;
  ulong uVar15;
  idx_t offset;
  idx_t local_210;
  Vector *local_208;
  buffer_ptr<ValidityBuffer> *local_200;
  Vector *local_1f8;
  Vector *local_1f0;
  data_ptr_t local_1e8;
  data_ptr_t local_1e0;
  idx_t local_1d8;
  DataChunk *local_1d0;
  data_ptr_t local_1c8;
  long local_1c0;
  ulong local_1b8;
  ValidityMask *local_1b0;
  Value local_1a8;
  ValidityMask entry_validity_mask;
  SelectionVector result_selection_vec;
  UnifiedVectorFormat input_list;
  UnifiedVectorFormat selection_lists;
  Vector local_98;
  
  this = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  this_00 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  count = args->count;
  local_1e8 = result->data;
  local_1d0 = args;
  local_1f0 = ListVector::GetEntry(result);
  UnifiedVectorFormat::UnifiedVectorFormat(&selection_lists);
  Vector::ToUnifiedFormat(this_00,count,&selection_lists);
  local_1e0 = selection_lists.data;
  other = ListVector::GetEntry(this_00);
  UnifiedVectorFormat::UnifiedVectorFormat(&input_list);
  Vector::ToUnifiedFormat(this,count,&input_list);
  local_1c8 = input_list.data;
  pVVar7 = ListVector::GetEntry(this);
  FlatVector::VerifyFlatVector(pVVar7);
  local_208 = pVVar7;
  local_1f8 = result;
  if (count == 0) {
    iVar12 = 0;
  }
  else {
    iVar13 = 0;
    iVar12 = 0;
    do {
      iVar8 = iVar13;
      if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
        iVar8 = (idx_t)(input_list.sel)->sel_vector[iVar13];
      }
      iVar14 = iVar13;
      if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
        iVar14 = (idx_t)(selection_lists.sel)->sel_vector[iVar13];
      }
      if (((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) ||
          ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar8 >> 6]
            >> (iVar8 & 0x3f) & 1) != 0)) &&
         ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0 ||
          ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
            [iVar14 >> 6] >> (iVar14 & 0x3f) & 1) != 0)))) {
        Vector::Vector(&local_98,other);
        iVar12 = iVar12 + *(long *)(local_1e0 + iVar14 * 0x10 + 8);
        if (local_98.auxiliary.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.auxiliary.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.buffer.internal.
            super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.buffer.internal.
                     super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        LogicalType::~LogicalType(&local_98.type);
      }
      iVar13 = iVar13 + 1;
    } while (count != iVar13);
  }
  pVVar7 = local_1f8;
  ListVector::Reserve(local_1f8,iVar12);
  SelectionVector::SelectionVector(&result_selection_vec,iVar12);
  this_02 = local_1f0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.capacity = iVar12;
  FlatVector::VerifyFlatVector(pVVar7);
  offset = 0;
  if (count != 0) {
    local_1b0 = &local_208->validity;
    local_200 = &(pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
    uVar15 = 0;
    do {
      uVar9 = uVar15;
      if ((selection_lists.sel)->sel_vector != (sel_t *)0x0) {
        uVar9 = (ulong)(selection_lists.sel)->sel_vector[uVar15];
      }
      if ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
           (unsigned_long *)0x0) ||
         ((selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
           [uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0)) {
        uVar11 = uVar15;
        if ((input_list.sel)->sel_vector != (sel_t *)0x0) {
          uVar11 = (ulong)(input_list.sel)->sel_vector[uVar15];
        }
        iVar12 = *(idx_t *)(local_1e0 + uVar9 * 0x10);
        local_1d8 = *(idx_t *)(local_1e0 + uVar9 * 0x10 + 8);
        if ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
             (unsigned_long *)0x0) &&
           ((input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
             [uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0)) {
          if ((pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            local_210 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_1a8,&local_210);
            peVar5 = local_1a8.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            uVar4 = local_1a8.type_._0_8_;
            local_1a8.type_._0_8_ = (element_type *)0x0;
            local_1a8.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            p_Var2 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                     internal.
                     super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
            (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar4;
            (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (local_1a8.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_1a8.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr);
            }
            pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_200);
            goto LAB_0141494c;
          }
          goto LAB_01414953;
        }
        iVar13 = *(idx_t *)(local_1c8 + uVar11 * 0x10);
        iVar8 = *(idx_t *)(local_1c8 + uVar11 * 0x10 + 8);
        local_1c0 = uVar15 * 0x10;
        *(idx_t *)(local_1e8 + local_1c0) = offset;
        local_1b8 = uVar15;
        if (local_1d8 != 0) {
          iVar14 = 0;
          do {
            Vector::GetValue(&local_1a8,other,iVar12 + iVar14);
            bVar6 = local_1a8.is_null;
            Value::~Value(&local_1a8);
            if (bVar6 == true) {
              this_01 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_1a8.type_._0_8_ =
                   &local_1a8.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1a8,
                         "NULLs are not allowed as list elements in the second input parameter.","")
              ;
              InvalidInputException::InvalidInputException(this_01,(string *)&local_1a8);
              __cxa_throw(this_01,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            SetSelectionVectorSelect::SetSelectionVector
                      (&result_selection_vec,&entry_validity_mask,local_1b0,other,iVar14,&offset,
                       iVar12,iVar13,iVar8);
            iVar14 = iVar14 + 1;
          } while (local_1d8 != iVar14);
        }
        *(idx_t *)((long)(local_1e8 + local_1c0) + 8) = offset - *(long *)(local_1e8 + local_1c0);
        this_02 = local_1f0;
        pVVar7 = local_1f8;
        uVar15 = local_1b8;
      }
      else {
        if ((pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_210 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_1a8,&local_210);
          peVar5 = local_1a8.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar4 = local_1a8.type_._0_8_;
          local_1a8.type_._0_8_ = (element_type *)0x0;
          local_1a8.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          p_Var2 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
          (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar4;
          (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar5;
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          if (local_1a8.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_1a8.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar10 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (local_200);
LAB_0141494c:
          (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar10->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
LAB_01414953:
        bVar3 = (byte)uVar15 & 0x3f;
        puVar1 = (pVVar7->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar15 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar3 | 0xfffffffffffffffeU >> 0x40 - bVar3);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != count);
  }
  Vector::Slice(this_02,local_208,&result_selection_vec,count);
  Vector::Flatten(this_02,offset);
  ListVector::SetListSize(pVVar7,offset);
  FlatVector::VerifyFlatVector(this_02);
  (this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
            (&(this_02->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
             &entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data);
  (this_02->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
       entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.capacity;
  bVar6 = DataChunk::AllConstant(local_1d0);
  Vector::SetVectorType(pVVar7,bVar6 * '\x02');
  if (entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (entry_validity_mask.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (result_selection_vec.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (result_selection_vec.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (input_list.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (input_list.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (input_list.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (selection_lists.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (selection_lists.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (selection_lists.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void ListSelectFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.data.size() == 2);
	Vector &list = args.data[0];
	Vector &selection_list = args.data[1];
	idx_t count = args.size();

	list_entry_t *result_data;
	result_data = FlatVector::GetData<list_entry_t>(result);
	auto &result_entry = ListVector::GetEntry(result);

	UnifiedVectorFormat selection_lists;
	selection_list.ToUnifiedFormat(count, selection_lists);
	auto selection_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(selection_lists);
	auto &selection_entry = ListVector::GetEntry(selection_list);

	UnifiedVectorFormat input_list;
	list.ToUnifiedFormat(count, input_list);
	auto input_lists_data = UnifiedVectorFormat::GetData<list_entry_t>(input_list);
	auto &input_entry = ListVector::GetEntry(list);
	auto &input_validity = FlatVector::Validity(input_entry);

	idx_t result_length = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t input_idx = input_list.sel->get_index(i);
		idx_t selection_idx = selection_lists.sel->get_index(i);
		if (input_list.validity.RowIsValid(input_idx) && selection_lists.validity.RowIsValid(selection_idx)) {
			OP::GetResultLength(args, result_length, selection_lists_data, selection_entry, selection_idx);
		}
	}

	ListVector::Reserve(result, result_length);
	SelectionVector result_selection_vec = SelectionVector(result_length);
	ValidityMask entry_validity_mask = ValidityMask(result_length);
	ValidityMask &result_validity_mask = FlatVector::Validity(result);

	idx_t offset = 0;
	for (idx_t j = 0; j < count; j++) {
		// Get length and offset of selection list for current output row
		auto selection_list_idx = selection_lists.sel->get_index(j);
		idx_t selection_len = 0;
		idx_t selection_offset = 0;
		if (selection_lists.validity.RowIsValid(selection_list_idx)) {
			selection_len = selection_lists_data[selection_list_idx].length;
			selection_offset = selection_lists_data[selection_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		// Get length and offset of input list for current output row
		auto input_list_idx = input_list.sel->get_index(j);
		idx_t input_length = 0;
		idx_t input_offset = 0;
		if (input_list.validity.RowIsValid(input_list_idx)) {
			input_length = input_lists_data[input_list_idx].length;
			input_offset = input_lists_data[input_list_idx].offset;
		} else {
			result_validity_mask.SetInvalid(j);
			continue;
		}
		result_data[j].offset = offset;
		// Set all selected values in the result
		for (idx_t child_idx = 0; child_idx < selection_len; child_idx++) {
			if (selection_entry.GetValue(selection_offset + child_idx).IsNull()) {
				throw InvalidInputException("NULLs are not allowed as list elements in the second input parameter.");
			}
			OP::SetSelectionVector(result_selection_vec, entry_validity_mask, input_validity, selection_entry,
			                       child_idx, offset, selection_offset, input_offset, input_length);
		}
		result_data[j].length = offset - result_data[j].offset;
	}
	result_entry.Slice(input_entry, result_selection_vec, count);
	result_entry.Flatten(offset);
	ListVector::SetListSize(result, offset);
	FlatVector::SetValidity(result_entry, entry_validity_mask);
	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
}